

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTypes.h
# Opt level: O0

bool glslang::isTypeSignedInt(TBasicType type)

{
  bool local_9;
  TBasicType type_local;
  
  if ((((type == EbtInt8) || (type == EbtInt16)) || (type == EbtInt)) || (type == EbtInt64)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

__inline bool isTypeSignedInt(TBasicType type)
{
    switch (type) {
    case EbtInt8:
    case EbtInt16:
    case EbtInt:
    case EbtInt64:
        return true;
    default:
        return false;
    }
}